

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::~ImFontAtlas(ImFontAtlas *this)

{
  ImFontAtlas_conflict *this_local;
  
  if ((this->Locked & 1U) != 0) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x7bf,"ImFontAtlas::~ImFontAtlas()");
  }
  Clear(this);
  ImVector<ImFontConfig>::~ImVector((ImVector<ImFontConfig> *)&this->ConfigData);
  ImVector<ImFontAtlasCustomRect>::~ImVector((ImVector<ImFontAtlasCustomRect> *)&this->CustomRects);
  ImVector<ImFont_*>::~ImVector((ImVector<ImFont_*> *)&this->Fonts);
  return;
}

Assistant:

ImFontAtlas::~ImFontAtlas()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    Clear();
}